

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O3

void __thiscall
embree::ParallelRadixSort<unsigned_long,_unsigned_long>::tbbRadixSort
          (ParallelRadixSort<unsigned_long,_unsigned_long> *this,size_t numTasks)

{
  void *pvVar1;
  
  pvVar1 = alignedMalloc(0x10000,0x40);
  *(void **)this = pvVar1;
  tbbRadixIteration(this,0,false,*(unsigned_long **)(this + 8),*(unsigned_long **)(this + 0x10),
                    numTasks);
  tbbRadixIteration(this,8,false,*(unsigned_long **)(this + 0x10),*(unsigned_long **)(this + 8),
                    numTasks);
  tbbRadixIteration(this,0x10,false,*(unsigned_long **)(this + 8),*(unsigned_long **)(this + 0x10),
                    numTasks);
  tbbRadixIteration(this,0x18,false,*(unsigned_long **)(this + 0x10),*(unsigned_long **)(this + 8),
                    numTasks);
  tbbRadixIteration(this,0x20,false,*(unsigned_long **)(this + 8),*(unsigned_long **)(this + 0x10),
                    numTasks);
  tbbRadixIteration(this,0x28,false,*(unsigned_long **)(this + 0x10),*(unsigned_long **)(this + 8),
                    numTasks);
  tbbRadixIteration(this,0x30,false,*(unsigned_long **)(this + 8),*(unsigned_long **)(this + 0x10),
                    numTasks);
  tbbRadixIteration(this,0x38,true,*(unsigned_long **)(this + 0x10),*(unsigned_long **)(this + 8),
                    numTasks);
  return;
}

Assistant:

void tbbRadixSort(const size_t numTasks)
    {
      radixCount = (TyRadixCount*) alignedMalloc(MAX_TASKS*sizeof(TyRadixCount),64);
      
      if (sizeof(Key) == sizeof(uint32_t)) {
        tbbRadixIteration(0*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(1*BITS,0,tmp,src,numTasks);
        tbbRadixIteration(2*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(3*BITS,1,tmp,src,numTasks);
      }
      else if (sizeof(Key) == sizeof(uint64_t))
      {
        tbbRadixIteration(0*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(1*BITS,0,tmp,src,numTasks);
        tbbRadixIteration(2*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(3*BITS,0,tmp,src,numTasks);
        tbbRadixIteration(4*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(5*BITS,0,tmp,src,numTasks);
        tbbRadixIteration(6*BITS,0,src,tmp,numTasks);
        tbbRadixIteration(7*BITS,1,tmp,src,numTasks);
      }
    }